

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCnst.cpp
# Opt level: O0

void __thiscall NaPNConstGen::set_out_dim(NaPNConstGen *this,uint nDim)

{
  undefined1 auVar1 [16];
  undefined4 *puVar2;
  ulong uVar3;
  void *pvVar4;
  int in_ESI;
  long in_RDI;
  
  NaPetriNode::check_tunable((NaPetriNode *)0x14b5cc);
  if (in_ESI == 0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 3;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  *(int *)(in_RDI + 200) = in_ESI;
  if (*(void **)(in_RDI + 0xd0) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0xd0));
  }
  auVar1 = ZEXT416(*(uint *)(in_RDI + 200)) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *(void **)(in_RDI + 0xd0) = pvVar4;
  return;
}

Assistant:

void
NaPNConstGen::set_out_dim (unsigned nDim)
{
    check_tunable();

    if(0 == nDim)
        throw(na_bad_value);

    nOutDim = nDim;

    delete[] fConstVal;
    fConstVal = new NaReal[nOutDim];
}